

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomvar.cpp
# Opt level: O0

void __thiscall MetaSim::DetVar::DetVar(DetVar *this,double *a,int s)

{
  int in_EDX;
  undefined8 *in_RDI;
  int i;
  value_type_conflict1 *in_stack_ffffffffffffffd8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe0;
  int local_18;
  
  RandomVar::RandomVar((RandomVar *)0x1fa4c0);
  *in_RDI = &PTR_clone_00235940;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1fa4e0);
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  *(undefined4 *)(in_RDI + 5) = 0;
  return;
}

Assistant:

DetVar::DetVar(double *a, int s)
    {
        for (int i = 0; i < s; ++i) 
            _array.push_back(a[i]);
        _count = 0;
    }